

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloat2Expanded
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1)

{
  ostringstream *this_00;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  StateQueryMemoryWriteGuard<int[2]> floatVector2;
  Hex<8UL> local_1d0;
  StateQueryMemoryWriteGuard<int[2]> local_1c8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  lVar4 = (long)((reference0 * 4.2949673e+09 + -1.0) * 0.5);
  uVar2 = lVar4 - 0x3ff;
  if (0x7ffffffe < (long)uVar2) {
    uVar2 = 0x7fffffff;
  }
  if ((long)uVar2 < -0x7fffffff) {
    uVar2 = 0xffffffff80000000;
  }
  lVar6 = (long)((reference1 * 4.2949673e+09 + -1.0) * 0.5);
  uVar3 = lVar6 - 0x3ff;
  if (0x7ffffffe < (long)uVar3) {
    uVar3 = 0x7fffffff;
  }
  if ((long)uVar3 < -0x7fffffff) {
    uVar3 = 0xffffffff80000000;
  }
  uVar5 = lVar4 + 0x3ff;
  if (0x7ffffffe < (long)uVar5) {
    uVar5 = 0x7fffffff;
  }
  if ((long)uVar5 < -0x7fffffff) {
    uVar5 = 0xffffffff80000000;
  }
  uVar7 = lVar6 + 0x3ff;
  if (0x7ffffffe < (long)uVar7) {
    uVar7 = 0x7fffffff;
  }
  if ((long)uVar7 < -0x7fffffff) {
    uVar7 = 0xffffffff80000000;
  }
  local_1c8.m_postguard[0] = -0x21212122;
  local_1c8.m_postguard[1] = -0x21212122;
  local_1c8.m_preguard[0] = -0x21212122;
  local_1c8.m_preguard[1] = -0x21212122;
  local_1c8.m_value[0] = -0x21212122;
  local_1c8.m_value[1] = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1c8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    (&local_1c8,testCtx);
  if (bVar1) {
    if (((int)uVar5 < local_1c8.m_value[0] || local_1c8.m_value[0] < (int)uVar2) ||
       ((int)uVar7 < local_1c8.m_value[1] || local_1c8.m_value[1] < (int)uVar3)) {
      local_1b0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected in ranges ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_1d0.value = uVar2 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_1d0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_1d0.value = uVar5 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_1d0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_1d0.value = uVar3 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_1d0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_1d0.value = uVar7 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_1d0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
      local_1d0.value = (ulong)local_1c8.m_value & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_1d0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_1d0.value = (ulong)local_1c8.m_value >> 0x20;
      tcu::Format::Hex<8UL>::toStream(&local_1d0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyFloat2Expanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1)
{
	DE_ASSERT(de::inRange(reference0, -1.0f, 1.0f));
	DE_ASSERT(de::inRange(reference1, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint referenceAsGLintMin[] =
	{
		clampToGLint(expandGLFloatToInteger(reference0) - FLOAT_EXPANSION_E),
		clampToGLint(expandGLFloatToInteger(reference1) - FLOAT_EXPANSION_E)
	};
	const GLint referenceAsGLintMax[] =
	{
		clampToGLint(expandGLFloatToInteger(reference0) + FLOAT_EXPANSION_E),
		clampToGLint(expandGLFloatToInteger(reference1) + FLOAT_EXPANSION_E)
	};

	StateQueryMemoryWriteGuard<GLint[2]> floatVector2;
	glGetIntegerv(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	if (floatVector2[0] < referenceAsGLintMin[0] || floatVector2[0] > referenceAsGLintMax[0] ||
		floatVector2[1] < referenceAsGLintMin[1] || floatVector2[1] > referenceAsGLintMax[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in ranges "
			<< "[" << toHex(referenceAsGLintMin[0]) << " " << toHex(referenceAsGLintMax[0]) << "], "
			<< "[" << toHex(referenceAsGLintMin[1]) << " " << toHex(referenceAsGLintMax[1]) << "]"
			<< "; got "
			<< toHex(floatVector2[0]) << ", "
			<< toHex(floatVector2[1]) << " "<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}